

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

int __thiscall ncnn::YoloDetectionOutput::create_pipeline(YoloDetectionOutput *this,Option *opt)

{
  Layer *pLVar1;
  undefined8 in_RSI;
  long in_RDI;
  ParamDict pd;
  undefined8 in_stack_fffffffffffff6d8;
  ParamDict *in_stack_fffffffffffff6e0;
  undefined1 local_910 [32];
  ParamDict *in_stack_fffffffffffff710;
  
  pLVar1 = create_layer((int)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
  *(Layer **)(in_RDI + 0xd0) = pLVar1;
  ParamDict::ParamDict(in_stack_fffffffffffff710);
  ParamDict::set((ParamDict *)local_910,0,0);
  (**(code **)(**(long **)(in_RDI + 0xd0) + 0x10))(*(long **)(in_RDI + 0xd0),local_910);
  (**(code **)(**(long **)(in_RDI + 0xd0) + 0x20))(*(long **)(in_RDI + 0xd0),in_RSI);
  ParamDict::~ParamDict(in_stack_fffffffffffff6e0);
  return 0;
}

Assistant:

int YoloDetectionOutput::create_pipeline(const Option& opt)
{
    {
        softmax = ncnn::create_layer(ncnn::LayerType::Softmax);

        ncnn::ParamDict pd;
        pd.set(0, 0);// axis

        softmax->load_param(pd);

        softmax->create_pipeline(opt);
    }

    return 0;
}